

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

void helics::addOperations(Filter *filt,FilterTypes type,Core *param_3)

{
  undefined4 in_ESI;
  shared_ptr<helics::FilterOperations> *in_RDI;
  shared_ptr<helics::FirewallFilterOperation> operation_5;
  shared_ptr<helics::CloneFilterOperation> operation_4;
  shared_ptr<helics::RerouteFilterOperation> operation_3;
  shared_ptr<helics::RandomDropFilterOperation> operation_2;
  shared_ptr<helics::DelayFilterOperation> operation_1;
  shared_ptr<helics::RandomDelayFilterOperation> operation;
  shared_ptr<helics::CloneFilterOperation> *in_stack_fffffffffffffe78;
  shared_ptr<helics::FilterOperations> *in_stack_fffffffffffffe80;
  shared_ptr<helics::FilterOperations> *this;
  shared_ptr<helics::FilterOperations> *in_stack_fffffffffffffeb8;
  Filter *in_stack_fffffffffffffec0;
  Filter *this_00;
  shared_ptr<helics::FilterOperations> local_d8 [3];
  Filter local_a8 [2];
  shared_ptr<helics::FilterOperations> *local_8;
  
  switch(in_ESI) {
  case 0:
    break;
  case 1:
    std::make_shared<helics::DelayFilterOperation>();
    std::shared_ptr<helics::FilterOperations>::shared_ptr<helics::DelayFilterOperation,void>
              (in_stack_fffffffffffffe80,
               (shared_ptr<helics::DelayFilterOperation> *)in_stack_fffffffffffffe78);
    Filter::setFilterOperations(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::shared_ptr<helics::FilterOperations>::~shared_ptr
              ((shared_ptr<helics::FilterOperations> *)0x310501);
    std::shared_ptr<helics::DelayFilterOperation>::~shared_ptr
              ((shared_ptr<helics::DelayFilterOperation> *)0x31050e);
    break;
  case 2:
    std::make_shared<helics::RandomDelayFilterOperation>();
    std::shared_ptr<helics::FilterOperations>::shared_ptr<helics::RandomDelayFilterOperation,void>
              (in_stack_fffffffffffffe80,
               (shared_ptr<helics::RandomDelayFilterOperation> *)in_stack_fffffffffffffe78);
    Filter::setFilterOperations(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::shared_ptr<helics::FilterOperations>::~shared_ptr
              ((shared_ptr<helics::FilterOperations> *)0x310468);
    std::shared_ptr<helics::RandomDelayFilterOperation>::~shared_ptr
              ((shared_ptr<helics::RandomDelayFilterOperation> *)0x310475);
    break;
  case 3:
    std::make_shared<helics::RandomDropFilterOperation>();
    std::shared_ptr<helics::FilterOperations>::shared_ptr<helics::RandomDropFilterOperation,void>
              (in_stack_fffffffffffffe80,
               (shared_ptr<helics::RandomDropFilterOperation> *)in_stack_fffffffffffffe78);
    Filter::setFilterOperations(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::shared_ptr<helics::FilterOperations>::~shared_ptr
              ((shared_ptr<helics::FilterOperations> *)0x31059a);
    std::shared_ptr<helics::RandomDropFilterOperation>::~shared_ptr
              ((shared_ptr<helics::RandomDropFilterOperation> *)0x3105a7);
    break;
  case 4:
    local_8 = in_RDI;
    std::make_shared<helics::RerouteFilterOperation>();
    this_00 = local_a8;
    std::shared_ptr<helics::FilterOperations>::shared_ptr<helics::RerouteFilterOperation,void>
              (in_stack_fffffffffffffe80,
               (shared_ptr<helics::RerouteFilterOperation> *)in_stack_fffffffffffffe78);
    Filter::setFilterOperations(this_00,local_8);
    std::shared_ptr<helics::FilterOperations>::~shared_ptr
              ((shared_ptr<helics::FilterOperations> *)0x310633);
    std::shared_ptr<helics::RerouteFilterOperation>::~shared_ptr
              ((shared_ptr<helics::RerouteFilterOperation> *)0x310640);
    break;
  case 5:
    std::make_shared<helics::CloneFilterOperation>();
    std::shared_ptr<helics::FilterOperations>::shared_ptr<helics::CloneFilterOperation,void>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    Filter::setFilterOperations(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::shared_ptr<helics::FilterOperations>::~shared_ptr
              ((shared_ptr<helics::FilterOperations> *)0x3106cc);
    std::shared_ptr<helics::CloneFilterOperation>::~shared_ptr
              ((shared_ptr<helics::CloneFilterOperation> *)0x3106d9);
    break;
  case 6:
    this = local_d8;
    std::make_shared<helics::FirewallFilterOperation>();
    std::shared_ptr<helics::FilterOperations>::shared_ptr<helics::FirewallFilterOperation,void>
              (this,(shared_ptr<helics::FirewallFilterOperation> *)in_stack_fffffffffffffe78);
    Filter::setFilterOperations(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::shared_ptr<helics::FilterOperations>::~shared_ptr
              ((shared_ptr<helics::FilterOperations> *)0x310765);
    std::shared_ptr<helics::FirewallFilterOperation>::~shared_ptr
              ((shared_ptr<helics::FirewallFilterOperation> *)0x310772);
  }
  return;
}

Assistant:

void addOperations(Filter* filt, FilterTypes type, Core* /*cptr*/)
{
    switch (type) {
        case FilterTypes::CUSTOM:
        default:
            break;
        case FilterTypes::RANDOM_DELAY: {
            auto operation = std::make_shared<RandomDelayFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::DELAY: {
            auto operation = std::make_shared<DelayFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::RANDOM_DROP: {
            auto operation = std::make_shared<RandomDropFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::REROUTE: {
            auto operation = std::make_shared<RerouteFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::CLONE: {
            auto operation = std::make_shared<CloneFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::FIREWALL: {
            auto operation = std::make_shared<FirewallFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
    }
}